

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_fare_rules_db(feed_db_t *db,fare_rule_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  fare_rule_t *pfVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  sqlite3_stmt *stmt;
  fare_rule_t record;
  char qr [84];
  sqlite3_stmt *local_1d0;
  fare_rule_t local_1c8;
  char local_88 [80];
  undefined4 local_38;
  
  bVar9 = 0;
  uVar2 = count_rows_db(db,"fare_rules");
  if (0 < (int)uVar2) {
    pcVar7 = "SELECT fare_id, route_id, origin_id, destination_id, contains_id FROM `fare_rules`;";
    pcVar8 = local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
      pcVar8 = pcVar8 + (ulong)bVar9 * -0x10 + 8;
    }
    local_38 = 0x3b6073;
    sqlite3_prepare_v2(db->conn,local_88,-1,&local_1d0,(char **)0x0);
    pfVar4 = (fare_rule_t *)malloc((ulong)uVar2 * 0x140);
    *records = pfVar4;
    uVar1 = 0xffffffff;
    if (pfVar4 != (fare_rule_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_1d0);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_fare_rule(&local_1c8);
        puVar5 = sqlite3_column_text(local_1d0,0);
        strcpy(local_1c8.fare_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,1);
        strcpy(local_1c8.route_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,2);
        strcpy(local_1c8.origin_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,3);
        strcpy(local_1c8.destination_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_1d0,4);
        strcpy(local_1c8.contains_id,(char *)puVar5);
        memcpy((*records)->fare_id + lVar6,&local_1c8,0x140);
        lVar6 = lVar6 + 0x140;
      } while ((ulong)uVar2 * 0x140 != lVar6);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_1d0);
  }
  return uVar2;
}

Assistant:

int fetch_all_fare_rules_db(feed_db_t *db, fare_rule_t **records) {

    fare_rule_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "fare_rules");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "fare_id, route_id, origin_id, destination_id, contains_id "
                "FROM `fare_rules`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_fare_rule(&record);

        strcpy(record.fare_id, sqlite3_column_text(stmt, 0));
        strcpy(record.route_id, sqlite3_column_text(stmt, 1));
        strcpy(record.origin_id, sqlite3_column_text(stmt, 2));
        strcpy(record.destination_id, sqlite3_column_text(stmt, 3));
        strcpy(record.contains_id, sqlite3_column_text(stmt, 4));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}